

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O0

bool llvm::ARM::getFPUFeatures
               (uint FPUKind,vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *Features)

{
  int iVar1;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *pvVar2;
  value_type local_438;
  value_type local_428;
  value_type local_418;
  value_type local_408;
  value_type local_3f8;
  value_type local_3e8;
  value_type local_3d8;
  value_type local_3c8;
  value_type local_3b8;
  value_type local_3a8;
  value_type local_398;
  value_type local_388;
  value_type local_378;
  value_type local_368;
  value_type local_358;
  value_type local_348;
  value_type local_338;
  value_type local_328;
  value_type local_318;
  value_type local_308;
  value_type local_2f8;
  value_type local_2e8;
  value_type local_2d8;
  value_type local_2c8;
  value_type local_2b8;
  value_type local_2a8;
  value_type local_298;
  value_type local_288;
  value_type local_278;
  value_type local_268;
  value_type local_258;
  value_type local_248;
  value_type local_238;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *local_228;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *Features_local;
  uint FPUKind_local;
  value_type *local_210;
  char *local_208;
  value_type *local_200;
  char *local_1f8;
  value_type *local_1f0;
  char *local_1e8;
  value_type *local_1e0;
  char *local_1d8;
  value_type *local_1d0;
  char *local_1c8;
  value_type *local_1c0;
  char *local_1b8;
  value_type *local_1b0;
  char *local_1a8;
  value_type *local_1a0;
  char *local_198;
  value_type *local_190;
  char *local_188;
  value_type *local_180;
  char *local_178;
  value_type *local_170;
  char *local_168;
  value_type *local_160;
  char *local_158;
  value_type *local_150;
  char *local_148;
  value_type *local_140;
  char *local_138;
  value_type *local_130;
  char *local_128;
  value_type *local_120;
  char *local_118;
  value_type *local_110;
  char *local_108;
  value_type *local_100;
  char *local_f8;
  value_type *local_f0;
  char *local_e8;
  value_type *local_e0;
  char *local_d8;
  value_type *local_d0;
  char *local_c8;
  value_type *local_c0;
  char *local_b8;
  value_type *local_b0;
  char *local_a8;
  value_type *local_a0;
  char *local_98;
  value_type *local_90;
  char *local_88;
  value_type *local_80;
  char *local_78;
  value_type *local_70;
  char *local_68;
  value_type *local_60;
  char *local_58;
  value_type *local_50;
  char *local_48;
  value_type *local_40;
  char *local_38;
  value_type *local_30;
  char *local_28;
  value_type *local_20;
  char *local_18;
  value_type *local_10;
  
  if ((FPUKind < 0x16) && (FPUKind != 0)) {
    iVar1 = *(int *)((long)&DAT_00301a58 + (ulong)FPUKind * 0x20 + 4);
    local_228 = Features;
    Features_local._0_4_ = FPUKind;
    if (iVar1 == 0) {
      local_1d0 = &local_278;
      local_1d8 = "-fp-only-sp";
      local_278.Data = "-fp-only-sp";
      local_278.Length = strlen("-fp-only-sp");
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(Features,&local_278)
      ;
      pvVar2 = local_228;
      local_1c0 = &local_288;
      local_1c8 = "-d16";
      local_288.Data = "-d16";
      local_288.Length = strlen("-d16");
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(pvVar2,&local_288);
    }
    else if (iVar1 == 1) {
      local_1f0 = &local_258;
      local_1f8 = "-fp-only-sp";
      local_258.Data = "-fp-only-sp";
      local_258.Length = strlen("-fp-only-sp");
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(Features,&local_258)
      ;
      pvVar2 = local_228;
      local_1e0 = &local_268;
      local_1e8 = "+d16";
      local_268.Data = "+d16";
      local_268.Length = strlen("+d16");
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(pvVar2,&local_268);
    }
    else if (iVar1 == 2) {
      local_210 = &local_238;
      _FPUKind_local = "+fp-only-sp";
      local_238.Data = "+fp-only-sp";
      local_238.Length = strlen("+fp-only-sp");
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(Features,&local_238)
      ;
      pvVar2 = local_228;
      local_200 = &local_248;
      local_208 = "+d16";
      local_248.Data = "+d16";
      local_248.Length = strlen("+d16");
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(pvVar2,&local_248);
    }
    pvVar2 = local_228;
    switch(*(undefined4 *)((long)&DAT_00301a50 + (ulong)(uint)Features_local * 0x20 + 4)) {
    case 0:
      local_b0 = &local_398;
      local_b8 = "-vfp2";
      local_398.Data = "-vfp2";
      local_398.Length = strlen("-vfp2");
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(pvVar2,&local_398);
      pvVar2 = local_228;
      local_a0 = &local_3a8;
      local_a8 = "-vfp3";
      local_3a8.Data = "-vfp3";
      local_3a8.Length = strlen("-vfp3");
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(pvVar2,&local_3a8);
      pvVar2 = local_228;
      local_90 = &local_3b8;
      local_98 = "-fp16";
      local_3b8.Data = "-fp16";
      local_3b8.Length = strlen("-fp16");
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(pvVar2,&local_3b8);
      pvVar2 = local_228;
      local_80 = &local_3c8;
      local_88 = "-vfp4";
      local_3c8.Data = "-vfp4";
      local_3c8.Length = strlen("-vfp4");
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(pvVar2,&local_3c8);
      pvVar2 = local_228;
      local_70 = &local_3d8;
      local_78 = "-fp-armv8";
      local_3d8.Data = "-fp-armv8";
      local_3d8.Length = strlen("-fp-armv8");
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(pvVar2,&local_3d8);
      break;
    case 1:
      local_100 = &local_348;
      local_108 = "+vfp2";
      local_348.Data = "+vfp2";
      local_348.Length = strlen("+vfp2");
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(pvVar2,&local_348);
      pvVar2 = local_228;
      local_f0 = &local_358;
      local_f8 = "-vfp3";
      local_358.Data = "-vfp3";
      local_358.Length = strlen("-vfp3");
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(pvVar2,&local_358);
      pvVar2 = local_228;
      local_e0 = &local_368;
      local_e8 = "-fp16";
      local_368.Data = "-fp16";
      local_368.Length = strlen("-fp16");
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(pvVar2,&local_368);
      pvVar2 = local_228;
      local_d0 = &local_378;
      local_d8 = "-vfp4";
      local_378.Data = "-vfp4";
      local_378.Length = strlen("-vfp4");
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(pvVar2,&local_378);
      pvVar2 = local_228;
      local_c0 = &local_388;
      local_c8 = "-fp-armv8";
      local_388.Data = "-fp-armv8";
      local_388.Length = strlen("-fp-armv8");
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(pvVar2,&local_388);
      break;
    case 2:
      local_140 = &local_308;
      local_148 = "+vfp3";
      local_308.Data = "+vfp3";
      local_308.Length = strlen("+vfp3");
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(pvVar2,&local_308);
      pvVar2 = local_228;
      local_130 = &local_318;
      local_138 = "-fp16";
      local_318.Data = "-fp16";
      local_318.Length = strlen("-fp16");
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(pvVar2,&local_318);
      pvVar2 = local_228;
      local_120 = &local_328;
      local_128 = "-vfp4";
      local_328.Data = "-vfp4";
      local_328.Length = strlen("-vfp4");
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(pvVar2,&local_328);
      pvVar2 = local_228;
      local_110 = &local_338;
      local_118 = "-fp-armv8";
      local_338.Data = "-fp-armv8";
      local_338.Length = strlen("-fp-armv8");
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(pvVar2,&local_338);
      break;
    case 3:
      local_180 = &local_2c8;
      local_188 = "+vfp3";
      local_2c8.Data = "+vfp3";
      local_2c8.Length = strlen("+vfp3");
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(pvVar2,&local_2c8);
      pvVar2 = local_228;
      local_170 = &local_2d8;
      local_178 = "+fp16";
      local_2d8.Data = "+fp16";
      local_2d8.Length = strlen("+fp16");
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(pvVar2,&local_2d8);
      pvVar2 = local_228;
      local_160 = &local_2e8;
      local_168 = "-vfp4";
      local_2e8.Data = "-vfp4";
      local_2e8.Length = strlen("-vfp4");
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(pvVar2,&local_2e8);
      pvVar2 = local_228;
      local_150 = &local_2f8;
      local_158 = "-fp-armv8";
      local_2f8.Data = "-fp-armv8";
      local_2f8.Length = strlen("-fp-armv8");
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(pvVar2,&local_2f8);
      break;
    case 4:
      local_1a0 = &local_2a8;
      local_1a8 = "+vfp4";
      local_2a8.Data = "+vfp4";
      local_2a8.Length = strlen("+vfp4");
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(pvVar2,&local_2a8);
      pvVar2 = local_228;
      local_190 = &local_2b8;
      local_198 = "-fp-armv8";
      local_2b8.Data = "-fp-armv8";
      local_2b8.Length = strlen("-fp-armv8");
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(pvVar2,&local_2b8);
      break;
    case 5:
      local_1b0 = &local_298;
      local_1b8 = "+fp-armv8";
      local_298.Data = "+fp-armv8";
      local_298.Length = strlen("+fp-armv8");
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(pvVar2,&local_298);
    }
    pvVar2 = local_228;
    iVar1 = *(int *)(&DAT_00301a58 + (ulong)(uint)Features_local * 4);
    if (iVar1 == 0) {
      local_20 = &local_428;
      local_28 = "-neon";
      local_428.Data = "-neon";
      local_428.Length = strlen("-neon");
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(pvVar2,&local_428);
      pvVar2 = local_228;
      local_10 = &local_438;
      local_18 = "-crypto";
      local_438.Data = "-crypto";
      local_438.Length = strlen("-crypto");
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(pvVar2,&local_438);
    }
    else if (iVar1 == 1) {
      local_40 = &local_408;
      local_48 = "+neon";
      local_408.Data = "+neon";
      local_408.Length = strlen("+neon");
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(pvVar2,&local_408);
      pvVar2 = local_228;
      local_30 = &local_418;
      local_38 = "-crypto";
      local_418.Data = "-crypto";
      local_418.Length = strlen("-crypto");
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(pvVar2,&local_418);
    }
    else if (iVar1 == 2) {
      local_60 = &local_3e8;
      local_68 = "+neon";
      local_3e8.Data = "+neon";
      local_3e8.Length = strlen("+neon");
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(pvVar2,&local_3e8);
      pvVar2 = local_228;
      local_50 = &local_3f8;
      local_58 = "+crypto";
      local_3f8.Data = "+crypto";
      local_3f8.Length = strlen("+crypto");
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(pvVar2,&local_3f8);
    }
    Features_local._7_1_ = true;
  }
  else {
    Features_local._7_1_ = false;
  }
  return Features_local._7_1_;
}

Assistant:

bool llvm::ARM::getFPUFeatures(unsigned FPUKind,
                               std::vector<StringRef> &Features) {

  if (FPUKind >= ARM::FK_LAST || FPUKind == ARM::FK_INVALID)
    return false;

  // fp-only-sp and d16 subtarget features are independent of each other, so we
  // must enable/disable both.
  switch (FPUNames[FPUKind].Restriction) {
  case ARM::FPURestriction::SP_D16:
    Features.push_back("+fp-only-sp");
    Features.push_back("+d16");
    break;
  case ARM::FPURestriction::D16:
    Features.push_back("-fp-only-sp");
    Features.push_back("+d16");
    break;
  case ARM::FPURestriction::None:
    Features.push_back("-fp-only-sp");
    Features.push_back("-d16");
    break;
  }

  // FPU version subtarget features are inclusive of lower-numbered ones, so
  // enable the one corresponding to this version and disable all that are
  // higher. We also have to make sure to disable fp16 when vfp4 is disabled,
  // as +vfp4 implies +fp16 but -vfp4 does not imply -fp16.
  switch (FPUNames[FPUKind].FPUVersion) {
  case ARM::FPUVersion::VFPV5:
    Features.push_back("+fp-armv8");
    break;
  case ARM::FPUVersion::VFPV4:
    Features.push_back("+vfp4");
    Features.push_back("-fp-armv8");
    break;
  case ARM::FPUVersion::VFPV3_FP16:
    Features.push_back("+vfp3");
    Features.push_back("+fp16");
    Features.push_back("-vfp4");
    Features.push_back("-fp-armv8");
    break;
  case ARM::FPUVersion::VFPV3:
    Features.push_back("+vfp3");
    Features.push_back("-fp16");
    Features.push_back("-vfp4");
    Features.push_back("-fp-armv8");
    break;
  case ARM::FPUVersion::VFPV2:
    Features.push_back("+vfp2");
    Features.push_back("-vfp3");
    Features.push_back("-fp16");
    Features.push_back("-vfp4");
    Features.push_back("-fp-armv8");
    break;
  case ARM::FPUVersion::NONE:
    Features.push_back("-vfp2");
    Features.push_back("-vfp3");
    Features.push_back("-fp16");
    Features.push_back("-vfp4");
    Features.push_back("-fp-armv8");
    break;
  }

  // crypto includes neon, so we handle this similarly to FPU version.
  switch (FPUNames[FPUKind].NeonSupport) {
  case ARM::NeonSupportLevel::Crypto:
    Features.push_back("+neon");
    Features.push_back("+crypto");
    break;
  case ARM::NeonSupportLevel::Neon:
    Features.push_back("+neon");
    Features.push_back("-crypto");
    break;
  case ARM::NeonSupportLevel::None:
    Features.push_back("-neon");
    Features.push_back("-crypto");
    break;
  }

  return true;
}